

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

BTreeImpl * __thiscall kj::_::BTreeImpl::operator=(BTreeImpl *this,BTreeImpl *other)

{
  if (this->tree != (NodeUnion *)EMPTY_NODE) {
    free(this->tree);
  }
  this->tree = other->tree;
  this->treeCapacity = other->treeCapacity;
  this->height = other->height;
  this->freelistHead = other->freelistHead;
  this->freelistSize = other->freelistSize;
  this->beginLeaf = other->beginLeaf;
  this->endLeaf = other->endLeaf;
  other->tree = (NodeUnion *)EMPTY_NODE;
  other->treeCapacity = 1;
  other->height = 0;
  other->freelistHead = 1;
  other->freelistSize = 0;
  other->beginLeaf = 0;
  other->endLeaf = 0;
  return this;
}

Assistant:

BTreeImpl& BTreeImpl::operator=(BTreeImpl&& other) {
  KJ_DASSERT(&other != this);

  if (tree != &EMPTY_NODE) {
    aligned_free(tree);
  }
  tree = other.tree;
  treeCapacity = other.treeCapacity;
  height = other.height;
  freelistHead = other.freelistHead;
  freelistSize = other.freelistSize;
  beginLeaf = other.beginLeaf;
  endLeaf = other.endLeaf;

  other.tree = const_cast<NodeUnion*>(&EMPTY_NODE);
  other.treeCapacity = 1;
  other.height = 0;
  other.freelistHead = 1;
  other.freelistSize = 0;
  other.beginLeaf = 0;
  other.endLeaf = 0;

  return *this;
}